

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

ushort __thiscall QLocale::toUShort(QLocale *this,QStringView s,bool *ok)

{
  long lVar1;
  QStringView str;
  unsigned_short uVar2;
  bool *in_RCX;
  QLocalePrivate *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::QSharedDataPointer::operator_cast_to_QLocalePrivate_
            ((QSharedDataPointer<QLocalePrivate> *)0x4cb864);
  str.m_data = (storage_type_conflict *)this;
  str.m_size = (qsizetype)ok;
  uVar2 = toIntegral_helper<unsigned_short>(in_RDI,str,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

ushort QLocale::toUShort(QStringView s, bool *ok) const
{
    return toIntegral_helper<ushort>(d, s, ok);
}